

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::DeleteDegenerateFaces(dgPolyhedra *this,HaF64 *pool,HaI32 strideInBytes,HaF64 area)

{
  int iVar1;
  HaI32 HVar2;
  dgTreeNode **ppdVar3;
  dgEdge *pdVar4;
  ulong uVar5;
  dgPolyhedra *this_00;
  dgPolyhedra *face;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Iterator local_70;
  dgStack<dgTree<dgEdge,_long>::dgTreeNode_*> faceArrayPool;
  dgBigVector normal;
  
  iVar1 = (this->super_dgTree<dgEdge,_long>).m_count;
  if (iVar1 != 0) {
    dgStack<dgTree<dgEdge,_long>::dgTreeNode_*>::dgStack(&faceArrayPool,iVar1 / 2 + 100);
    uVar6 = 0;
    this_00 = (dgPolyhedra *)0x0;
    ppdVar3 = dgStack<dgTree<dgEdge,_long>::dgTreeNode_*>::operator[](&faceArrayPool,0);
    HVar2 = IncLRU(this);
    local_70.m_tree = &this->super_dgTree<dgEdge,_long>;
    local_70.m_ptr =
         &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
    while ((dgTreeNode *)local_70.m_ptr != (dgTreeNode *)0x0) {
      if ((((dgEdge *)((long)local_70.m_ptr + 0x28))->m_mark != HVar2) &&
         (0 < ((dgEdge *)((long)local_70.m_ptr + 0x28))->m_incidentFace)) {
        ppdVar3[(int)uVar6] = (dgTreeNode *)local_70.m_ptr;
        pdVar4 = (dgEdge *)((long)local_70.m_ptr + 0x28);
        do {
          pdVar4->m_mark = HVar2;
          pdVar4 = pdVar4->m_next;
        } while (pdVar4 != (dgEdge *)((long)local_70.m_ptr + 0x28));
        uVar6 = uVar6 + 1;
      }
      this_00 = (dgPolyhedra *)0x0;
      dgTree<dgEdge,_long>::Iterator::operator++(&local_70,0);
    }
    for (uVar5 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != uVar5; uVar5 = uVar5 + 1) {
      face = (dgPolyhedra *)&ppdVar3[uVar5]->m_info;
      FaceNormal(&normal,this_00,(dgEdge *)face,pool,strideInBytes);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = normal.super_dgTemplateVector<double>.m_x;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = normal.super_dgTemplateVector<double>.m_z;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = normal.super_dgTemplateVector<double>.m_y *
                     normal.super_dgTemplateVector<double>.m_y;
      auVar7 = vfmadd231sd_fma(auVar8,auVar7,auVar7);
      auVar7 = vfmadd213sd_fma(auVar9,auVar9,auVar7);
      if (auVar7._0_8_ < (double)area * (double)area * 4.0) {
        DeleteFace(this,(dgEdge *)face);
        this_00 = face;
      }
    }
    free(faceArrayPool.super_dgStackBase.m_ptr);
  }
  return;
}

Assistant:

void dgPolyhedra::DeleteDegenerateFaces (const hacd::HaF64* const pool, hacd::HaI32 strideInBytes, hacd::HaF64 area)
{
	if (!GetCount()) {
		return;
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
	dgStack <dgPolyhedra::dgTreeNode*> faceArrayPool(GetCount() / 2 + 100);

	hacd::HaI32 count = 0;
	dgPolyhedra::dgTreeNode** const faceArray = &faceArrayPool[0];
	hacd::HaI32 mark = IncLRU();
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);

		if ((edge->m_mark != mark) && (edge->m_incidentFace > 0)) {
			faceArray[count] = iter.GetNode();
			count ++;
			dgEdge* ptr = edge;
			do	{
				ptr->m_mark = mark;
				ptr = ptr->m_next;
			} while (ptr != edge);
		}
	}

	hacd::HaF64 area2 = area * area;
	area2 *= hacd::HaF64 (4.0f);

	for (hacd::HaI32 i = 0; i < count; i ++) {
		dgPolyhedra::dgTreeNode* const faceNode = faceArray[i];
		dgEdge* const edge = &faceNode->GetInfo();

		dgBigVector normal (FaceNormal (edge, pool, strideInBytes));

		hacd::HaF64 faceArea = normal % normal;
		if (faceArea < area2) {
			DeleteFace (edge);
		}
	}

#ifdef __ENABLE_SANITY_CHECK 
	mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if ((edge->m_mark != mark) && (edge->m_incidentFace > 0)) {
			//HACD_ASSERT (edge->m_next->m_next->m_next == edge);
			dgEdge* ptr = edge;
			do	{
				ptr->m_mark = mark;
				ptr = ptr->m_next;
			} while (ptr != edge);

			dgBigVector normal (FaceNormal (edge, pool, strideInBytes));

			hacd::HaF64 faceArea = normal % normal;
			HACD_ASSERT (faceArea >= area2);
		}
	}
	HACD_ASSERT (SanityCheck ());
#endif
}